

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ExpandMacroResult __thiscall
cmCMakePresetsGraphInternal::BaseMacroExpander::operator()
          (BaseMacroExpander *this,string *macroNamespace,string *macroName,string *macroOut,
          int version)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileOrDir;
  string local_b8;
  string_view local_98;
  string local_88;
  string local_58;
  int local_34;
  string *psStack_30;
  int version_local;
  string *macroOut_local;
  string *macroName_local;
  string *macroNamespace_local;
  BaseMacroExpander *this_local;
  
  local_34 = version;
  psStack_30 = macroOut;
  macroOut_local = macroName;
  macroName_local = macroNamespace;
  macroNamespace_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    bVar1 = std::operator==(macroOut_local,"sourceDir");
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)psStack_30,(string *)&this->Graph->SourceDir);
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"sourceParentDir");
    if (bVar1) {
      cmsys::SystemTools::GetParentDirectory(&local_58,&this->Graph->SourceDir);
      std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"sourceDirName");
    if (bVar1) {
      cmsys::SystemTools::GetFilenameName(&local_88,&this->Graph->SourceDir);
      std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"dollar");
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)psStack_30,'$');
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"hostSystemName");
    if (bVar1) {
      if (local_34 < 3) {
        return Error;
      }
      local_98 = cmSystemTools::GetSystemName();
      std::__cxx11::string::operator+=((string *)psStack_30,&local_98);
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"fileDir");
    if ((bVar1) && (bVar1 = std::optional::operator_cast_to_bool((optional *)&this->File), bVar1)) {
      if (local_34 < 4) {
        return Error;
      }
      fileOrDir = std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&this->File);
      cmsys::SystemTools::GetParentDirectory(&local_b8,fileOrDir);
      std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      return Ok;
    }
    bVar1 = std::operator==(macroOut_local,"pathListSep");
    if (bVar1) {
      if (local_34 < 5) {
        return Error;
      }
      cVar2 = cmSystemTools::GetSystemPathlistSeparator();
      std::__cxx11::string::operator+=((string *)psStack_30,cVar2);
      return Ok;
    }
  }
  return Ignore;
}

Assistant:

ExpandMacroResult BaseMacroExpander::operator()(
  const std::string& macroNamespace, const std::string& macroName,
  std::string& macroOut, int version) const
{
  if (macroNamespace.empty()) {
    if (macroName == "sourceDir") {
      macroOut += Graph.SourceDir;
      return ExpandMacroResult::Ok;
    }
    if (macroName == "sourceParentDir") {
      macroOut += cmSystemTools::GetParentDirectory(Graph.SourceDir);
      return ExpandMacroResult::Ok;
    }
    if (macroName == "sourceDirName") {
      macroOut += cmSystemTools::GetFilenameName(Graph.SourceDir);
      return ExpandMacroResult::Ok;
    }
    if (macroName == "dollar") {
      macroOut += '$';
      return ExpandMacroResult::Ok;
    }
    if (macroName == "hostSystemName") {
      if (version < 3) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetSystemName();
      return ExpandMacroResult::Ok;
    }
    // Enable fileDir macro expansion for non-preset expanders
    if (macroName == "fileDir" && File) {
      if (version < 4) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetParentDirectory(File.value());
      return ExpandMacroResult::Ok;
    }
    if (macroName == "pathListSep") {
      if (version < 5) {
        return ExpandMacroResult::Error;
      }
      macroOut += cmSystemTools::GetSystemPathlistSeparator();
      return ExpandMacroResult::Ok;
    }
  }

  return ExpandMacroResult::Ignore;
}